

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.cpp
# Opt level: O2

vector<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
wallet::ListDatabases_abi_cxx11_
          (vector<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,wallet *this,path *wallet_dir)

{
  long lVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool bVar3;
  char cVar4;
  int iVar5;
  path *ppVar6;
  path *ppVar7;
  path *ppVar8;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  recursive_directory_iterator it;
  error_code ec;
  path local_1f8;
  path local_1d0;
  path local_1a8;
  path local_180;
  path local_158;
  path local_130;
  path local_108;
  path local_e0;
  path local_b8;
  path local_90;
  path path;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->
  super__Vector_base<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            (&it,(path *)this,&ec);
  do {
    _Var2._M_pi = it._M_dirs._M_refcount._M_pi;
    path.super_path._M_pathname._M_dataplus._M_p = (pointer)0x0;
    path.super_path._M_pathname._M_string_length = 0;
    std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
              ((recursive_directory_iterator *)&path.super_path);
    if (_Var2._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&it);
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return __return_storage_ptr__;
    }
    if (ec._M_value == 0) {
      std::filesystem::__cxx11::recursive_directory_iterator::operator*(&it);
      std::filesystem::__cxx11::path::lexically_relative((path *)&local_e0);
      std::filesystem::__cxx11::path::path(&path.super_path,&local_e0);
      std::filesystem::__cxx11::path::~path(&local_e0);
      ppVar8 = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*(&it);
      cVar4 = std::filesystem::status(ppVar8);
      if (cVar4 == '\x02') {
        ppVar6 = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*(&it);
        std::filesystem::__cxx11::path::path(&local_158,ppVar6);
        std::filesystem::__cxx11::path::path(&local_130,&local_158);
        BDBDataFile((path *)&local_108,(path *)&local_130);
        bVar3 = IsBDBFile((path *)&local_108);
        std::filesystem::__cxx11::path::~path(&local_108);
        std::filesystem::__cxx11::path::~path(&local_130);
        std::filesystem::__cxx11::path::~path(&local_158);
        if (bVar3) {
LAB_008ff6c5:
          std::
          vector<std::pair<fs::path,std::__cxx11::string>,std::allocator<std::pair<fs::path,std::__cxx11::string>>>
          ::emplace_back<fs::path_const&,char_const(&)[4]>
                    ((vector<std::pair<fs::path,std::__cxx11::string>,std::allocator<std::pair<fs::path,std::__cxx11::string>>>
                      *)__return_storage_ptr__,(path *)&path.super_path,(char (*) [4])0xdfef66);
        }
        else {
          ppVar6 = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*(&it);
          std::filesystem::__cxx11::path::path(&local_180,ppVar6);
          std::filesystem::__cxx11::path::path(&local_130,&local_180);
          SQLiteDataFile((path *)&local_108,(path *)&local_130);
          bVar3 = IsSQLiteFile((path *)&local_108);
          std::filesystem::__cxx11::path::~path(&local_108);
          std::filesystem::__cxx11::path::~path(&local_130);
          std::filesystem::__cxx11::path::~path(&local_180);
          if (bVar3) {
            std::
            vector<std::pair<fs::path,std::__cxx11::string>,std::allocator<std::pair<fs::path,std::__cxx11::string>>>
            ::emplace_back<fs::path_const&,char_const(&)[7]>
                      ((vector<std::pair<fs::path,std::__cxx11::string>,std::allocator<std::pair<fs::path,std::__cxx11::string>>>
                        *)__return_storage_ptr__,(path *)&path.super_path,(char (*) [7])"sqlite");
          }
        }
      }
      else {
        iVar5 = std::filesystem::__cxx11::recursive_directory_iterator::depth();
        if (iVar5 == 0) {
          ppVar8 = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*(&it);
          cVar4 = std::filesystem::symlink_status(ppVar8);
          if (cVar4 == '\x01') {
            ppVar6 = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*(&it);
            std::filesystem::__cxx11::path::extension(&local_108,ppVar6);
            std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
                      (&local_130,(char (*) [5])0xe08a58,auto_format);
            bVar3 = std::filesystem::__cxx11::operator==(&local_108,&local_130);
            std::filesystem::__cxx11::path::~path(&local_130);
            std::filesystem::__cxx11::path::~path(&local_108);
            if (!bVar3) {
              ppVar6 = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*
                                         (&it);
              std::filesystem::__cxx11::path::filename(&local_108,ppVar6);
              std::filesystem::__cxx11::path::path<char[11],std::filesystem::__cxx11::path>
                        (&local_130,(char (*) [11])"wallet.dat",auto_format);
              bVar3 = std::filesystem::__cxx11::operator==(&local_108,&local_130);
              std::filesystem::__cxx11::path::~path(&local_130);
              std::filesystem::__cxx11::path::~path(&local_108);
              if (bVar3) {
                ppVar6 = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*
                                           (&it);
                std::filesystem::__cxx11::path::path(&local_1a8,ppVar6);
                std::filesystem::__cxx11::path::path(&local_108,&local_1a8);
                bVar3 = IsBDBFile((path *)&local_108);
                std::filesystem::__cxx11::path::~path(&local_108);
                std::filesystem::__cxx11::path::~path(&local_1a8);
                if (bVar3) {
                  local_108._M_pathname.field_2._M_allocated_capacity = 0;
                  local_108._M_pathname.field_2._8_8_ = 0;
                  local_108._M_pathname._M_dataplus._M_p = (pointer)0x0;
                  local_108._M_pathname._M_string_length = 0;
                  local_108._M_cmpts._M_impl._M_t.
                  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                  _M_head_impl = (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                  )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
                                    )0x0;
                  std::filesystem::__cxx11::path::path(&local_108);
                  std::
                  vector<std::pair<fs::path,std::__cxx11::string>,std::allocator<std::pair<fs::path,std::__cxx11::string>>>
                  ::emplace_back<fs::path,char_const(&)[4]>
                            ((vector<std::pair<fs::path,std::__cxx11::string>,std::allocator<std::pair<fs::path,std::__cxx11::string>>>
                              *)__return_storage_ptr__,(path *)&local_108,(char (*) [4])0xdfef66);
                }
                else {
                  ppVar6 = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*
                                             (&it);
                  std::filesystem::__cxx11::path::path(&local_1d0,ppVar6);
                  std::filesystem::__cxx11::path::path(&local_108,&local_1d0);
                  bVar3 = IsSQLiteFile((path *)&local_108);
                  std::filesystem::__cxx11::path::~path(&local_108);
                  std::filesystem::__cxx11::path::~path(&local_1d0);
                  if (!bVar3) goto LAB_008ff937;
                  local_108._M_pathname.field_2._M_allocated_capacity = 0;
                  local_108._M_pathname.field_2._8_8_ = 0;
                  local_108._M_pathname._M_dataplus._M_p = (pointer)0x0;
                  local_108._M_pathname._M_string_length = 0;
                  local_108._M_cmpts._M_impl._M_t.
                  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                  _M_head_impl = (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                  )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
                                    )0x0;
                  std::filesystem::__cxx11::path::path(&local_108);
                  std::
                  vector<std::pair<fs::path,std::__cxx11::string>,std::allocator<std::pair<fs::path,std::__cxx11::string>>>
                  ::emplace_back<fs::path,char_const(&)[7]>
                            ((vector<std::pair<fs::path,std::__cxx11::string>,std::allocator<std::pair<fs::path,std::__cxx11::string>>>
                              *)__return_storage_ptr__,(path *)&local_108,(char (*) [7])"sqlite");
                }
                std::filesystem::__cxx11::path::~path(&local_108);
              }
              else {
                ppVar6 = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*
                                           (&it);
                std::filesystem::__cxx11::path::path(&local_1f8,ppVar6);
                std::filesystem::__cxx11::path::path(&local_108,&local_1f8);
                bVar3 = IsBDBFile((path *)&local_108);
                std::filesystem::__cxx11::path::~path(&local_108);
                std::filesystem::__cxx11::path::~path(&local_1f8);
                if (bVar3) goto LAB_008ff6c5;
              }
            }
          }
        }
      }
LAB_008ff937:
      std::filesystem::__cxx11::path::~path(&path.super_path);
    }
    else {
      ppVar6 = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*(&it);
      bVar3 = std::filesystem::is_directory(ppVar6);
      ppVar6 = &local_90;
      if (bVar3) {
        std::filesystem::__cxx11::recursive_directory_iterator::disable_recursion_pending();
        (**(code **)(*(long *)ec._M_cat + 0x20))(&local_108,ec._M_cat,ec._M_value);
        ppVar7 = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*(&it);
        std::filesystem::__cxx11::path::path(ppVar6,ppVar7);
        std::filesystem::__cxx11::path::path(&path.super_path,ppVar6);
        std::filesystem::__cxx11::path::string(&local_130._M_pathname,&path.super_path);
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/db.cpp"
        ;
        source_file._M_len = 0x5d;
        logging_function._M_str = "ListDatabases";
        logging_function._M_len = 0xd;
        LogPrintFormatInternal<char[14],std::__cxx11::string,std::__cxx11::string>
                  (logging_function,source_file,0x20,ALL,Info,(ConstevalFormatString<3U>)0xdf0c04,
                   (char (*) [14])"ListDatabases",&local_108._M_pathname,&local_130._M_pathname);
      }
      else {
        (**(code **)(*(long *)ec._M_cat + 0x20))(&local_108,ec._M_cat,ec._M_value);
        ppVar7 = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*(&it);
        ppVar6 = &local_b8;
        std::filesystem::__cxx11::path::path(ppVar6,ppVar7);
        std::filesystem::__cxx11::path::path(&path.super_path,ppVar6);
        std::filesystem::__cxx11::path::string(&local_130._M_pathname,&path.super_path);
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/db.cpp"
        ;
        source_file_00._M_len = 0x5d;
        logging_function_00._M_str = "ListDatabases";
        logging_function_00._M_len = 0xd;
        LogPrintFormatInternal<char[14],std::__cxx11::string,std::__cxx11::string>
                  (logging_function_00,source_file_00,0x22,ALL,Info,
                   (ConstevalFormatString<3U>)0xdf0c1c,(char (*) [14])"ListDatabases",
                   &local_108._M_pathname,&local_130._M_pathname);
      }
      std::__cxx11::string::~string((string *)&local_130);
      std::filesystem::__cxx11::path::~path(&path.super_path);
      std::filesystem::__cxx11::path::~path(ppVar6);
      std::__cxx11::string::~string((string *)&local_108);
    }
    std::filesystem::__cxx11::recursive_directory_iterator::increment((error_code *)&it);
  } while( true );
}

Assistant:

std::vector<std::pair<fs::path, std::string>> ListDatabases(const fs::path& wallet_dir)
{
    std::vector<std::pair<fs::path, std::string>> paths;
    std::error_code ec;

    for (auto it = fs::recursive_directory_iterator(wallet_dir, ec); it != fs::recursive_directory_iterator(); it.increment(ec)) {
        if (ec) {
            if (fs::is_directory(*it)) {
                it.disable_recursion_pending();
                LogPrintf("%s: %s %s -- skipping.\n", __func__, ec.message(), fs::PathToString(it->path()));
            } else {
                LogPrintf("%s: %s %s\n", __func__, ec.message(), fs::PathToString(it->path()));
            }
            continue;
        }

        try {
            const fs::path path{it->path().lexically_relative(wallet_dir)};

            if (it->status().type() == fs::file_type::directory) {
                if (IsBDBFile(BDBDataFile(it->path()))) {
                    // Found a directory which contains wallet.dat btree file, add it as a wallet with BERKELEY format.
                    paths.emplace_back(path, "bdb");
                } else if (IsSQLiteFile(SQLiteDataFile(it->path()))) {
                    // Found a directory which contains wallet.dat sqlite file, add it as a wallet with SQLITE format.
                    paths.emplace_back(path, "sqlite");
                }
            } else if (it.depth() == 0 && it->symlink_status().type() == fs::file_type::regular && it->path().extension() != ".bak") {
                if (it->path().filename() == "wallet.dat") {
                    // Found top-level wallet.dat file, add top level directory ""
                    // as a wallet.
                    if (IsBDBFile(it->path())) {
                        paths.emplace_back(fs::path(), "bdb");
                    } else if (IsSQLiteFile(it->path())) {
                        paths.emplace_back(fs::path(), "sqlite");
                    }
                } else if (IsBDBFile(it->path())) {
                    // Found top-level btree file not called wallet.dat. Current bitcoin
                    // software will never create these files but will allow them to be
                    // opened in a shared database environment for backwards compatibility.
                    // Add it to the list of available wallets.
                    paths.emplace_back(path, "bdb");
                }
            }
        } catch (const std::exception& e) {
            LogPrintf("%s: Error scanning %s: %s\n", __func__, fs::PathToString(it->path()), e.what());
            it.disable_recursion_pending();
        }
    }

    return paths;
}